

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void __thiscall Log::~Log(Log *this)

{
  char *pcVar1;
  pointer pcVar2;
  LogFile *this_00;
  LogMessage *this_01;
  
  LogMessage::Append(&this->log_message,"     [FileName:",0xf);
  LogMessage::Append(&this->log_message,(this->filename)._M_dataplus._M_p,
                     (int)(this->filename)._M_string_length);
  LogMessage::Append(&this->log_message," ",1);
  LogMessage::Append(&this->log_message,"Line:",5);
  this_01 = LogMessage::operator<<(&this->log_message,this->line);
  LogMessage::Append(this_01,"]\n",2);
  this_00 = log_file;
  if (log_file != (LogFile *)0x0) {
    pcVar1 = (this->log_message).message;
    (this->log_message).message = (char *)0x0;
    LogFile::put_write_string(this_00,pcVar1);
  }
  pcVar2 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->filename).field_2) {
    operator_delete(pcVar2);
  }
  pcVar1 = (this->log_message).message;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
    return;
  }
  return;
}

Assistant:

Log::~Log()
{
    log_message<<"     [FileName:"<<filename<<" "<<"Line:"<<line<<"]\n";
    if(log_file != nullptr)
    {
        log_file->put_write_string(log_message.GetMessage());
    }
}